

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<std::tuple<bool,int,int>,std::tuple<bool,int,int>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,tuple<bool,_int,_int> *expected,tuple<bool,_int,_int> *actual)

{
  tuple<bool,_int,_int> *ptVar1;
  string local_68;
  string local_48;
  
  if ((((expected->super__Tuple_impl<0UL,_bool,_int,_int>).super__Head_base<0UL,_bool,_false>.
        _M_head_impl == (bool)actual_str[8]) &&
      ((expected->super__Tuple_impl<0UL,_bool,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
       super__Head_base<1UL,_int,_false>._M_head_impl == *(int *)(actual_str + 4))) &&
     ((expected->super__Tuple_impl<0UL,_bool,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
      super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl ==
      *(int *)actual_str)) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    ptVar1 = (tuple<bool,_int,_int> *)actual_str;
    FormatForComparisonFailureMessage<std::tuple<bool,int,int>,std::tuple<bool,int,int>>
              (&local_48,(internal *)actual_str,expected,(tuple<bool,_int,_int> *)actual_str);
    FormatForComparisonFailureMessage<std::tuple<bool,int,int>,std::tuple<bool,int,int>>
              (&local_68,(internal *)expected,(tuple<bool,_int,_int> *)actual_str,ptVar1);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }